

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sc_list.cpp
# Opt level: O1

void * __thiscall sc_core::sc_plist_base::front(sc_plist_base *this)

{
  void *pvVar1;
  
  if (this->head == (handle_t)0x0) {
    pvVar1 = (void *)0x0;
    sc_report_handler::report
              (SC_ERROR,"attempt to take front() on an empty list",(char *)0x0,
               "/workspace/llm4binary/github/license_all_cmakelists_25/ucirvinelecs[P]systemc/src/sysc/utils/sc_list.cpp"
               ,0xe2);
  }
  else {
    pvVar1 = this->head->data;
  }
  return pvVar1;
}

Assistant:

void*
sc_plist_base::front() const
{

   if (head) {			
        return head->data;
    }				
    else {
      SC_REPORT_ERROR( SC_ID_FRONT_ON_EMPTY_LIST_ , 0 );
      // never reached
      return 0;
    }
}